

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O1

vector<int,_std::allocator<int>_> *
common_sampler_sample_and_accept_n
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,common_sampler *gsmpl,
          llama_context *ctx,llama_tokens *draft,bool grammar_first)

{
  undefined1 auVar1 [16];
  long lVar2;
  long lVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  vector<int,_std::allocator<int>_> idxs;
  allocator_type local_49;
  vector<int,_std::allocator<int>_> local_48;
  
  std::vector<int,_std::allocator<int>_>::vector
            (&local_48,
             ((long)(draft->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(draft->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 2) + 1,&local_49);
  auVar1 = _DAT_00213100;
  if ((long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 0) {
    lVar2 = (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    lVar2 = lVar2 + (ulong)(lVar2 == 0);
    lVar3 = lVar2 + -1;
    auVar5._8_4_ = (int)lVar3;
    auVar5._0_8_ = lVar3;
    auVar5._12_4_ = (int)((ulong)lVar3 >> 0x20);
    uVar4 = 0;
    auVar5 = auVar5 ^ _DAT_00213100;
    auVar6 = _DAT_002130f0;
    do {
      auVar7 = auVar6 ^ auVar1;
      if ((bool)(~(auVar7._4_4_ == auVar5._4_4_ && auVar5._0_4_ < auVar7._0_4_ ||
                  auVar5._4_4_ < auVar7._4_4_) & 1)) {
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar4] = (int)uVar4;
      }
      if ((auVar7._12_4_ != auVar5._12_4_ || auVar7._8_4_ <= auVar5._8_4_) &&
          auVar7._12_4_ <= auVar5._12_4_) {
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar4 + 1] = (int)uVar4 + 1;
      }
      uVar4 = uVar4 + 2;
      lVar3 = auVar6._8_8_;
      auVar6._0_8_ = auVar6._0_8_ + 2;
      auVar6._8_8_ = lVar3 + 2;
    } while ((lVar2 + 1U & 0xfffffffffffffffe) != uVar4);
  }
  common_sampler_sample_and_accept_n(__return_storage_ptr__,gsmpl,ctx,&local_48,draft,grammar_first)
  ;
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<llama_token> common_sampler_sample_and_accept_n(struct common_sampler * gsmpl, struct llama_context * ctx, const llama_tokens & draft, bool grammar_first) {
    std::vector<int> idxs(draft.size() + 1);
    for (size_t i = 0; i < idxs.size(); ++i) {
        idxs[i] = i;
    }

    return common_sampler_sample_and_accept_n(gsmpl, ctx, idxs, draft, grammar_first);
}